

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::snarfBufferedLineBreak(HttpInputStreamImpl *this)

{
  char *pcVar1;
  size_t sVar2;
  byte bVar3;
  
  bVar3 = this->lineBreakBeforeNextHeader;
  pcVar1 = (this->leftover).ptr;
  sVar2 = (this->leftover).size_;
  do {
    while( true ) {
      if (((bVar3 & 1) == 0) || (sVar2 == 0)) {
        return;
      }
      if (*pcVar1 != '\n') break;
      pcVar1 = pcVar1 + 1;
      sVar2 = sVar2 - 1;
      (this->leftover).ptr = pcVar1;
      (this->leftover).size_ = sVar2;
LAB_00310e81:
      this->lineBreakBeforeNextHeader = false;
      bVar3 = 0;
    }
    if (*pcVar1 != '\r') goto LAB_00310e81;
    pcVar1 = pcVar1 + 1;
    sVar2 = sVar2 - 1;
    (this->leftover).ptr = pcVar1;
    (this->leftover).size_ = sVar2;
  } while( true );
}

Assistant:

void snarfBufferedLineBreak() {
    // Slightly-crappy code to snarf the expected line break. This will actually eat the leading
    // regex /\r*\n?/.
    while (lineBreakBeforeNextHeader && leftover.size() > 0) {
      if (leftover[0] == '\r') {
        leftover = leftover.slice(1, leftover.size());
      } else if (leftover[0] == '\n') {
        leftover = leftover.slice(1, leftover.size());
        lineBreakBeforeNextHeader = false;
      } else {
        // Err, missing line break, whatever.
        lineBreakBeforeNextHeader = false;
      }
    }
  }